

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

void __thiscall
PhyloTree::getEdges(PhyloTree *this,
                   vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges_to_add)

{
  pointer pPVar1;
  PhyloTreeEdge *edge;
  pointer __x;
  
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (edges_to_add,
             ((long)(this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
             .super__Vector_impl_data._M_start; __x != pPVar1; __x = __x + 1) {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(edges_to_add,__x);
  }
  return;
}

Assistant:

void PhyloTree::getEdges(vector<PhyloTreeEdge>& edges_to_add) {
    edges_to_add.reserve(edges.size());
    for (auto &edge : edges) {
        edges_to_add.push_back(edge);
    }
}